

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void codeDistinct(Parse *pParse,int iTab,int addrRepeat,int N,int iMem)

{
  Vdbe *p;
  byte bVar1;
  int addr;
  long lVar2;
  int p3;
  
  p = pParse->pVdbe;
  if (pParse->nTempReg == '\0') {
    p3 = pParse->nMem + 1;
    pParse->nMem = p3;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    p3 = pParse->aTempReg[bVar1];
  }
  addr = sqlite3VdbeAddOp3(p,0x34,iTab,addrRepeat,iMem);
  sqlite3VdbeChangeP4(p,addr,(char *)(long)N,-0xe);
  sqlite3VdbeAddOp3(p,0x1f,iMem,N,p3);
  sqlite3VdbeAddOp3(p,0x61,iTab,p3,0);
  if (p3 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      lVar2 = 0;
      do {
        if (*(int *)((long)&pParse->aColCache[0].iReg + lVar2) == p3) {
          (&pParse->aColCache[0].tempReg)[lVar2] = '\x01';
          return;
        }
        lVar2 = lVar2 + 0x18;
      } while ((int)lVar2 != 0xf0);
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = p3;
    }
  }
  return;
}

Assistant:

static void codeDistinct(
  Parse *pParse,     /* Parsing and code generating context */
  int iTab,          /* A sorting index used to test for distinctness */
  int addrRepeat,    /* Jump to here if not distinct */
  int N,             /* Number of elements */
  int iMem           /* First element */
){
  Vdbe *v;
  int r1;

  v = pParse->pVdbe;
  r1 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp4Int(v, OP_Found, iTab, addrRepeat, iMem, N);
  sqlite3VdbeAddOp3(v, OP_MakeRecord, iMem, N, r1);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iTab, r1);
  sqlite3ReleaseTempReg(pParse, r1);
}